

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

string * __thiscall
chaiscript::exception::eval_error::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this)

{
  undefined8 *puVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  pointer psVar4;
  shared_ptr<const_chaiscript::AST_Node> *t;
  shared_ptr<const_chaiscript::AST_Node> *t_00;
  shared_ptr<const_chaiscript::AST_Node> *t_01;
  ulong uVar5;
  long lVar6;
  ostringstream ss;
  undefined1 auStack_1f8 [8];
  string local_1f0;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = (char *)(**(code **)(*(long *)this + 0x10))(this);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x50);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
  }
  if ((this->call_stack).
      super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->call_stack).
      super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"during evaluation at (",0x16);
    puVar1 = *(undefined8 **)
              &((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&((((this->call_stack).
                              super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->location + 0x10))->
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)*puVar1,puVar1[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    startpos<std::shared_ptr<chaiscript::AST_Node_const>>
              (&local_1f0,
               (eval_error *)
               (this->call_stack).
               super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start,t);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                                local_1f0._M_dataplus._M_p._0_1_),
                        local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
        &local_1f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p._0_1_ = 10;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)&local_1f0,1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(this->detail)._M_dataplus._M_p,(this->detail)._M_string_length);
    local_1f0._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f0,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    puVar1 = *(undefined8 **)
              &((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&((((this->call_stack).
                              super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->location + 0x10))->
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)*puVar1,puVar1[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    startpos<std::shared_ptr<chaiscript::AST_Node_const>>
              (&local_1f0,
               (eval_error *)
               (this->call_stack).
               super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start,t_00);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                                local_1f0._M_dataplus._M_p._0_1_),
                        local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") \'",3);
    (**((((this->call_stack).
          super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       _vptr_AST_Node)(&local_1d0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1d0,local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
        &local_1f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    psVar4 = (this->call_stack).
             super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0x10 < (ulong)((long)(this->call_stack).
                             super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4)) {
      uVar5 = 1;
      lVar6 = 0x10;
      do {
        if ((*(uint *)(*(long *)((long)&(psVar4->
                                        super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + lVar6) + 0x18) | 8) != 0x1f) {
          local_1f0._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1f0,1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  from ",7);
          puVar1 = *(undefined8 **)
                    (*(long *)((long)&(((this->call_stack).
                                        super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar6) + 0x50);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)*puVar1,puVar1[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
          startpos<std::shared_ptr<chaiscript::AST_Node_const>>
                    (&local_1f0,
                     (eval_error *)
                     ((long)&(((this->call_stack).
                               super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar6),t_01);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                                      local_1f0._M_dataplus._M_p._0_1_),
                              local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,") \'",3);
          (**(code **)**(undefined8 **)
                        ((long)&(((this->call_stack).
                                  super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar6))(&local_1d0);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(char *)local_1d0,local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
          if (local_1d0 != local_1c0) {
            operator_delete(local_1d0,local_1c0[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
              &local_1f0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                     local_1f0._M_dataplus._M_p._0_1_),
                            local_1f0.field_2._M_allocated_capacity + 1);
          }
        }
        uVar5 = uVar5 + 1;
        psVar4 = (this->call_stack).
                 super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x10;
      } while (uVar5 < (ulong)((long)(this->call_stack).
                                     super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4)
              );
    }
  }
  local_1f0._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1f0,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1b0;
}

Assistant:

std::string pretty_print() const
      {
        std::ostringstream ss;

        ss << what();
        if (call_stack.size() > 0) {
          ss << "during evaluation at (" << fname(call_stack[0]) << " " << startpos(call_stack[0]) << ")\n";
          ss << '\n' << detail << '\n';
          ss << "  " << fname(call_stack[0]) << " (" << startpos(call_stack[0]) << ") '" << pretty(call_stack[0]) << "'";
          for (size_t j = 1; j < call_stack.size(); ++j) {
            if (id(call_stack[j]) != chaiscript::AST_Node_Type::Block
                && id(call_stack[j]) != chaiscript::AST_Node_Type::File)
            {
              ss << '\n';
              ss << "  from " << fname(call_stack[j]) << " (" << startpos(call_stack[j]) << ") '" << pretty(call_stack[j]) << "'";
            }
          }
        }
        ss << '\n';
        return ss.str();
      }